

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_extra_test.cc
# Opt level: O3

void __thiscall
EVPExtraTest_DigestVerifyInit_Test::TestBody(EVPExtraTest_DigestVerifyInit_Test *this)

{
  int iVar1;
  EVP_MD *type;
  char *in_R9;
  UniquePtr<EVP_PKEY> pkey;
  ScopedEVP_MD_CTX md_ctx;
  AssertHelper AStack_78;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_70;
  internal local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  string local_58;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_38;
  EVP_MD_CTX local_30;
  
  LoadExampleRSAKey();
  EVP_MD_CTX_init((EVP_MD_CTX *)&local_30);
  local_68[0] = (internal)((EVP_PKEY *)local_38._M_head_impl != (EVP_PKEY *)0x0);
  local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY *)local_38._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_58,local_68,(AssertionResult *)0x583608,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
               ,0x198,local_58._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
  }
  else {
    type = EVP_sha256();
    iVar1 = EVP_DigestVerifyInit
                      ((EVP_MD_CTX *)&local_30,(EVP_PKEY_CTX **)0x0,type,(ENGINE *)0x0,
                       (EVP_PKEY *)local_38._M_head_impl);
    local_68[0] = (internal)(iVar1 != 0);
    local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_70);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,local_68,
                 (AssertionResult *)
                 "EVP_DigestVerifyInit(md_ctx.get(), __null, EVP_sha256(), __null, pkey.get())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_78,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                 ,0x19a,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
    }
    else {
      iVar1 = EVP_DigestVerifyUpdate(&local_30,"\x01\x02\x03\x04",4);
      local_68[0] = (internal)(iVar1 != 0);
      local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (iVar1 == 0) {
        testing::Message::Message((Message *)&local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_58,local_68,
                   (AssertionResult *)"EVP_DigestVerifyUpdate(md_ctx.get(), kMsg, sizeof(kMsg))",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x19b,local_58._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
      }
      else {
        iVar1 = EVP_DigestVerifyFinal((EVP_MD_CTX *)&local_30,kSignature,0x80);
        local_68[0] = (internal)(iVar1 != 0);
        local_60 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if ((bool)local_68[0]) goto LAB_0027683d;
        testing::Message::Message((Message *)&local_70);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_58,local_68,
                   (AssertionResult *)
                   "EVP_DigestVerifyFinal(md_ctx.get(), kSignature, sizeof(kSignature))","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&AStack_78,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_extra_test.cc"
                   ,0x19d,local_58._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&AStack_78,(Message *)&local_70);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_70._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_70._M_head_impl + 8))();
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_60,local_60);
  }
LAB_0027683d:
  EVP_MD_CTX_cleanup((EVP_MD_CTX *)&local_30);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_38);
  return;
}

Assistant:

TEST(EVPExtraTest, DigestVerifyInit) {
  bssl::UniquePtr<EVP_PKEY> pkey = LoadExampleRSAKey();
  bssl::ScopedEVP_MD_CTX md_ctx;
  ASSERT_TRUE(pkey);
  ASSERT_TRUE(
      EVP_DigestVerifyInit(md_ctx.get(), NULL, EVP_sha256(), NULL, pkey.get()));
  ASSERT_TRUE(EVP_DigestVerifyUpdate(md_ctx.get(), kMsg, sizeof(kMsg)));
  ASSERT_TRUE(
      EVP_DigestVerifyFinal(md_ctx.get(), kSignature, sizeof(kSignature)));
}